

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

bool __thiscall Rml::DataViewRml::Update(DataViewRml *this,DataModel *model)

{
  char cVar1;
  bool bVar2;
  Element *element_00;
  DataExpression *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  String new_rml;
  DataExpressionInterface expr_interface;
  Element *element;
  Variant variant;
  bool result;
  DataModel *model_local;
  DataViewRml *this_local;
  
  variant.data[0x1f] = '\0';
  Variant::Variant((Variant *)&element);
  element_00 = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface
            ((DataExpressionInterface *)((long)&new_rml.field_2 + 8),model,element_00,(Event *)0x0);
  if (element_00 != (Element *)0x0) {
    this_00 = DataViewCommon::GetExpression(&this->super_DataViewCommon);
    bVar2 = DataExpression::Run(this_00,(DataExpressionInterface *)((long)&new_rml.field_2 + 8),
                                (Variant *)&element);
    if (bVar2) {
      ::std::__cxx11::string::string((string *)&local_b8);
      Variant::Get<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 (Variant *)&element,&local_b8);
      ::std::__cxx11::string::~string((string *)&local_b8);
      bVar2 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_98,&this->previous_rml);
      if (bVar2) {
        Element::SetInnerRML(element_00,(String *)local_98);
        ::std::__cxx11::string::operator=((string *)&this->previous_rml,(string *)local_98);
        variant.data[0x1f] = '\x01';
      }
      ::std::__cxx11::string::~string((string *)local_98);
    }
  }
  cVar1 = variant.data[0x1f];
  Variant::~Variant((Variant *)&element);
  return (bool)(cVar1 & 1);
}

Assistant:

bool DataViewRml::Update(DataModel& model)
{
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		String new_rml = variant.Get<String>();
		if (new_rml != previous_rml)
		{
			element->SetInnerRML(new_rml);
			previous_rml = std::move(new_rml);
			result = true;
		}
	}
	return result;
}